

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_lvalue.cpp
# Opt level: O1

void __thiscall
iu_StringSplitLvalueCovertToInt_x_iutest_x_ByStlStrView_Test<char>::Body
          (iu_StringSplitLvalueCovertToInt_x_iutest_x_ByStlStrView_Test<char> *this)

{
  char *in_R9;
  vector<int,_std::allocator<int>_> re2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> s;
  AssertionResult iutest_ar;
  allocator<char> local_251;
  vector<int,_std::allocator<int>_> local_250;
  string local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  undefined1 *local_1f8;
  undefined8 local_1f0;
  undefined1 local_1e8;
  undefined7 uStack_1e7;
  char local_1d8;
  AssertionHelper local_1d0;
  undefined1 local_1a0 [128];
  ios_base local_120 [264];
  
  local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"123, 421, 113","");
  local_1a0._0_8_ = 2;
  local_1a0._8_8_ = ", ";
  ::detail::
  operator|<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_yumetodo[P]string_split_test_test_lvalue_cpp:401:103),_false,_false,_nullptr>
            (&local_250,&local_218,
             (split_helper_conv_func<std::basic_string_view<char,_std::char_traits<char>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_yumetodo[P]string_split_test_test_lvalue_cpp:401:103),_false,_false,_false>
              *)local_1a0);
  if ((long)local_250.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish -
      (long)local_250.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start == 0xc) {
    local_1d8 = (int)*(long *)((long)local_250.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                     .super__Vector_impl_data._M_start + 8) == 0x71 &&
                *(long *)local_250.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start == 0x1a50000007b;
  }
  else {
    local_1d8 = false;
  }
  local_1f0 = 0;
  local_1e8 = 0;
  local_1f8 = &local_1e8;
  if ((bool)local_1d8 == false) {
    memset((iu_global_format_stringstream *)local_1a0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1a0);
    iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
              (&local_238,(internal *)&local_1f8,
               (AssertionResult *)"std::equal(re1.begin(), re1.end(), re2.begin(), re2.end())",
               "false","true",in_R9);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1d0,local_238._M_dataplus._M_p,&local_251);
    local_1d0.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/yumetodo[P]string_split/test/test_lvalue.cpp"
    ;
    local_1d0.m_part_result.super_iuCodeMessage.m_line = 0x194;
    local_1d0.m_part_result.super_iuCodeMessage._44_4_ = 2;
    iutest::AssertionHelper::OnFixed(&local_1d0,(Fixed *)local_1a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_1d0.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_1d0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_1d0.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != &local_238.field_2) {
      operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1a0);
    std::ios_base::~ios_base(local_120);
  }
  if (local_1f8 != &local_1e8) {
    operator_delete(local_1f8,CONCAT71(uStack_1e7,local_1e8) + 1);
  }
  if ((long *)local_250.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start != (long *)0x0) {
    operator_delete(local_250.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_250.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_250.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

IUTEST_TYPED_TEST(StringSplitLvalue, chain_at_last_by_c_str)
{
	using char_type = TypeParam;
	const std::basic_string<char_type> s = constant::arikitari_na_world_underscore<char_type>();
	const auto re = s | split(constant::space_underscore<char_type>()) >> at_last();
	IUTEST_ASSERT(2u == re.size());
	IUTEST_ASSERT_EQ(constant::arikitari_na<char_type>(), re[0]);
	IUTEST_ASSERT_EQ(constant::world<char_type>(), re[1]);
}